

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O3

void coins_tests::GetCoinsMapEntry(CCoinsMap *map,CAmount *value,char *flags,COutPoint *outp)

{
  char cVar1;
  long lVar2;
  const_iterator cVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = std::
          _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&map->_M_h,outp);
  if (cVar3.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>._M_cur ==
      (__node_type *)0x0) {
    *value = -2;
    *flags = -1;
  }
  else {
    *value = *(CAmount *)
              ((long)cVar3.
                     super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                     _M_cur + 0x48);
    cVar1 = *(char *)((long)cVar3.
                            super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                            ._M_cur + 0x40);
    *flags = cVar1;
    if (cVar1 == -1) {
      __assert_fail("flags != NO_ENTRY",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                    ,0x26c,
                    "void coins_tests::GetCoinsMapEntry(const CCoinsMap &, CAmount &, char &, const COutPoint &)"
                   );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void GetCoinsMapEntry(const CCoinsMap& map, CAmount& value, char& flags, const COutPoint& outp = OUTPOINT)
{
    auto it = map.find(outp);
    if (it == map.end()) {
        value = ABSENT;
        flags = NO_ENTRY;
    } else {
        if (it->second.coin.IsSpent()) {
            value = SPENT;
        } else {
            value = it->second.coin.out.nValue;
        }
        flags = it->second.GetFlags();
        assert(flags != NO_ENTRY);
    }
}